

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTD_rescaleFreqs(optState_t *optPtr,BYTE *src,size_t srcSize,int optLevel)

{
  short sVar1;
  ZSTD_paramSwitch_e ZVar2;
  ZSTD_entropyCTables_t *pZVar3;
  undefined1 auVar4 [16];
  U32 UVar5;
  undefined8 in_RAX;
  long lVar6;
  uint *puVar7;
  long lVar8;
  uint *puVar9;
  uint uVar10;
  byte bVar11;
  undefined1 auVar12 [16];
  int iVar13;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined1 auVar14 [16];
  uint uVar18;
  uint uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  uint lit;
  undefined8 uStack_18;
  
  bVar11 = 0;
  ZVar2 = optPtr->literalCompressionMode;
  optPtr->priceType = zop_dynamic;
  uStack_18 = in_RAX;
  if (optPtr->litLengthSum == 0) {
    if (srcSize < 9) {
      optPtr->priceType = zop_predef;
    }
    pZVar3 = optPtr->symbolCosts;
    if (pZVar3 == (ZSTD_entropyCTables_t *)0x0) {
      __assert_fail("optPtr->symbolCosts != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7fbe,
                    "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                   );
    }
    if ((pZVar3->huf).repeatMode == HUF_repeat_valid) {
      optPtr->priceType = zop_dynamic;
      if (ZVar2 != ZSTD_ps_disable) {
        puVar7 = optPtr->litFreq;
        if (puVar7 == (uint *)0x0) {
          __assert_fail("optPtr->litFreq != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7fc7,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        optPtr->litSum = 0;
        lVar6 = 0;
        do {
          bVar11 = (byte)(pZVar3->huf).CTable[lVar6 + 1];
          if (0xb < bVar11) {
            __assert_fail("bitCost <= scaleLog",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x7fcc,
                          "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                         );
          }
          uVar10 = 1 << (0xb - bVar11 & 0x1f);
          if (bVar11 == 0) {
            uVar10 = 1;
          }
          puVar7[lVar6] = uVar10;
          optPtr->litSum = optPtr->litSum + uVar10;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x100);
      }
      sVar1 = (short)(pZVar3->fse).litlengthCTable[0];
      lVar6 = 1;
      if (sVar1 != 0) {
        lVar6 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      }
      optPtr->litLengthSum = 0;
      lVar8 = 0;
      do {
        uVar10 = (pZVar3->fse).litlengthCTable[lVar6 + lVar8 * 2 + 2] + 0xffff;
        if (0x9ffff < uVar10) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7fd8,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        uVar18 = 1 << (10U - (char)(uVar10 >> 0x10) & 0x1f);
        if (uVar10 < 0x10000) {
          uVar18 = 1;
        }
        optPtr->litLengthFreq[lVar8] = uVar18;
        optPtr->litLengthSum = optPtr->litLengthSum + uVar18;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x24);
      sVar1 = (short)(pZVar3->fse).matchlengthCTable[0];
      lVar6 = 1;
      if (sVar1 != 0) {
        lVar6 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      }
      optPtr->matchLengthSum = 0;
      lVar8 = 0;
      do {
        uVar10 = (pZVar3->fse).matchlengthCTable[lVar6 + lVar8 * 2 + 2] + 0xffff;
        if (0x9ffff < uVar10) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7fe4,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        uVar18 = 1 << (10U - (char)(uVar10 >> 0x10) & 0x1f);
        if (uVar10 < 0x10000) {
          uVar18 = 1;
        }
        optPtr->matchLengthFreq[lVar8] = uVar18;
        optPtr->matchLengthSum = optPtr->matchLengthSum + uVar18;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x35);
      sVar1 = (short)(pZVar3->fse).offcodeCTable[0];
      lVar6 = 1;
      if (sVar1 != 0) {
        lVar6 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      }
      optPtr->offCodeSum = 0;
      lVar8 = 0;
      do {
        uVar10 = (pZVar3->fse).offcodeCTable[lVar6 + lVar8 * 2 + 2] + 0xffff;
        if (0x9ffff < uVar10) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7ff0,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        uVar18 = 1 << (10U - (char)(uVar10 >> 0x10) & 0x1f);
        if (uVar10 < 0x10000) {
          uVar18 = 1;
        }
        optPtr->offCodeFreq[lVar8] = uVar18;
        optPtr->offCodeSum = optPtr->offCodeSum + uVar18;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x20);
      goto LAB_001b228b;
    }
    if (optPtr->litFreq == (uint *)0x0) {
      __assert_fail("optPtr->litFreq != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7ff7,
                    "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                   );
    }
    if (ZVar2 != ZSTD_ps_disable) {
      uStack_18 = CONCAT44(0xff,(int)in_RAX);
      HIST_count_simple(optPtr->litFreq,(uint *)((long)&uStack_18 + 4),src,srcSize);
      puVar7 = optPtr->litFreq;
      lVar6 = 0;
      iVar13 = 0;
      iVar15 = 0;
      iVar16 = 0;
      iVar17 = 0;
      do {
        puVar9 = puVar7 + lVar6;
        uVar10 = ((*puVar9 >> 8) - (uint)(*puVar9 == 0)) + 1;
        uVar18 = ((puVar9[1] >> 8) - (uint)(puVar9[1] == 0)) + 1;
        uVar19 = ((puVar9[2] >> 8) - (uint)(puVar9[2] == 0)) + 1;
        uVar20 = ((puVar9[3] >> 8) - (uint)(puVar9[3] == 0)) + 1;
        iVar13 = iVar13 + uVar10;
        iVar15 = iVar15 + uVar18;
        iVar16 = iVar16 + uVar19;
        iVar17 = iVar17 + uVar20;
        puVar9 = puVar7 + lVar6;
        *puVar9 = uVar10;
        puVar9[1] = uVar18;
        puVar9[2] = uVar19;
        puVar9[3] = uVar20;
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x100);
      optPtr->litSum = iVar17 + iVar15 + iVar16 + iVar13;
    }
    memcpy(optPtr->litLengthFreq,&DAT_00268600,0x90);
    optPtr->litLengthSum = 0x28;
    auVar4 = _DAT_001e3030;
    puVar7 = optPtr->matchLengthFreq;
    lVar6 = 3;
    auVar12 = _DAT_001e3020;
    auVar14 = _DAT_001e2fc0;
    do {
      auVar21 = auVar14 ^ auVar4;
      if (auVar21._4_4_ == -0x80000000 && auVar21._0_4_ < -0x7fffffcb) {
        puVar7[lVar6 + -3] = 1;
        puVar7[lVar6 + -2] = 1;
      }
      auVar21 = auVar12 ^ auVar4;
      if (auVar21._4_4_ == -0x80000000 && auVar21._0_4_ < -0x7fffffcb) {
        puVar7[lVar6 + -1] = 1;
        puVar7[lVar6] = 1;
      }
      lVar8 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar8 + 4;
      lVar8 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar8 + 4;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x3b);
    optPtr->matchLengthSum = 0x35;
    puVar7 = &DAT_00268690;
    puVar9 = optPtr->offCodeFreq;
    for (lVar6 = 0x20; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar9 = *puVar7;
      puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
      puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
    }
    UVar5 = 0x35;
  }
  else {
    if (ZVar2 != ZSTD_ps_disable) {
      UVar5 = ZSTD_scaleStats(optPtr->litFreq,0xff,0xc);
      optPtr->litSum = UVar5;
    }
    UVar5 = ZSTD_scaleStats(optPtr->litLengthFreq,0x23,0xb);
    optPtr->litLengthSum = UVar5;
    UVar5 = ZSTD_scaleStats(optPtr->matchLengthFreq,0x34,0xb);
    optPtr->matchLengthSum = UVar5;
    UVar5 = ZSTD_scaleStats(optPtr->offCodeFreq,0x1f,0xb);
  }
  optPtr->offCodeSum = UVar5;
LAB_001b228b:
  ZSTD_setBasePrices(optPtr,optLevel);
  return;
}

Assistant:

static void
ZSTD_rescaleFreqs(optState_t* const optPtr,
            const BYTE* const src, size_t const srcSize,
                  int const optLevel)
{
    int const compressedLiterals = ZSTD_compressedLiterals(optPtr);
    DEBUGLOG(5, "ZSTD_rescaleFreqs (srcSize=%u)", (unsigned)srcSize);
    optPtr->priceType = zop_dynamic;

    if (optPtr->litLengthSum == 0) {  /* no literals stats collected -> first block assumed -> init */

        /* heuristic: use pre-defined stats for too small inputs */
        if (srcSize <= ZSTD_PREDEF_THRESHOLD) {
            DEBUGLOG(5, "srcSize <= %i : use predefined stats", ZSTD_PREDEF_THRESHOLD);
            optPtr->priceType = zop_predef;
        }

        assert(optPtr->symbolCosts != NULL);
        if (optPtr->symbolCosts->huf.repeatMode == HUF_repeat_valid) {

            /* huffman stats covering the full value set : table presumed generated by dictionary */
            optPtr->priceType = zop_dynamic;

            if (compressedLiterals) {
                /* generate literals statistics from huffman table */
                unsigned lit;
                assert(optPtr->litFreq != NULL);
                optPtr->litSum = 0;
                for (lit=0; lit<=MaxLit; lit++) {
                    U32 const scaleLog = 11;   /* scale to 2K */
                    U32 const bitCost = HUF_getNbBitsFromCTable(optPtr->symbolCosts->huf.CTable, lit);
                    assert(bitCost <= scaleLog);
                    optPtr->litFreq[lit] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litSum += optPtr->litFreq[lit];
            }   }

            {   unsigned ll;
                FSE_CState_t llstate;
                FSE_initCState(&llstate, optPtr->symbolCosts->fse.litlengthCTable);
                optPtr->litLengthSum = 0;
                for (ll=0; ll<=MaxLL; ll++) {
                    U32 const scaleLog = 10;   /* scale to 1K */
                    U32 const bitCost = FSE_getMaxNbBits(llstate.symbolTT, ll);
                    assert(bitCost < scaleLog);
                    optPtr->litLengthFreq[ll] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litLengthSum += optPtr->litLengthFreq[ll];
            }   }

            {   unsigned ml;
                FSE_CState_t mlstate;
                FSE_initCState(&mlstate, optPtr->symbolCosts->fse.matchlengthCTable);
                optPtr->matchLengthSum = 0;
                for (ml=0; ml<=MaxML; ml++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(mlstate.symbolTT, ml);
                    assert(bitCost < scaleLog);
                    optPtr->matchLengthFreq[ml] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->matchLengthSum += optPtr->matchLengthFreq[ml];
            }   }

            {   unsigned of;
                FSE_CState_t ofstate;
                FSE_initCState(&ofstate, optPtr->symbolCosts->fse.offcodeCTable);
                optPtr->offCodeSum = 0;
                for (of=0; of<=MaxOff; of++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(ofstate.symbolTT, of);
                    assert(bitCost < scaleLog);
                    optPtr->offCodeFreq[of] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->offCodeSum += optPtr->offCodeFreq[of];
            }   }

        } else {  /* first block, no dictionary */

            assert(optPtr->litFreq != NULL);
            if (compressedLiterals) {
                /* base initial cost of literals on direct frequency within src */
                unsigned lit = MaxLit;
                HIST_count_simple(optPtr->litFreq, &lit, src, srcSize);   /* use raw first block to init statistics */
                optPtr->litSum = ZSTD_downscaleStats(optPtr->litFreq, MaxLit, 8, base_0possible);
            }

            {   unsigned const baseLLfreqs[MaxLL+1] = {
                    4, 2, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1
                };
                ZSTD_memcpy(optPtr->litLengthFreq, baseLLfreqs, sizeof(baseLLfreqs));
                optPtr->litLengthSum = sum_u32(baseLLfreqs, MaxLL+1);
            }

            {   unsigned ml;
                for (ml=0; ml<=MaxML; ml++)
                    optPtr->matchLengthFreq[ml] = 1;
            }
            optPtr->matchLengthSum = MaxML+1;

            {   unsigned const baseOFCfreqs[MaxOff+1] = {
                    6, 2, 1, 1, 2, 3, 4, 4,
                    4, 3, 2, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1
                };
                ZSTD_memcpy(optPtr->offCodeFreq, baseOFCfreqs, sizeof(baseOFCfreqs));
                optPtr->offCodeSum = sum_u32(baseOFCfreqs, MaxOff+1);
            }

        }

    } else {   /* new block : scale down accumulated statistics */

        if (compressedLiterals)
            optPtr->litSum = ZSTD_scaleStats(optPtr->litFreq, MaxLit, 12);
        optPtr->litLengthSum = ZSTD_scaleStats(optPtr->litLengthFreq, MaxLL, 11);
        optPtr->matchLengthSum = ZSTD_scaleStats(optPtr->matchLengthFreq, MaxML, 11);
        optPtr->offCodeSum = ZSTD_scaleStats(optPtr->offCodeFreq, MaxOff, 11);
    }

    ZSTD_setBasePrices(optPtr, optLevel);
}